

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_uint nk_tt__find_table(nk_byte *data,nk_uint fontstart,char *tag)

{
  bool bVar1;
  ushort uVar2;
  uint uVar3;
  undefined4 in_register_00000034;
  long lVar4;
  
  uVar2 = *(ushort *)(data + 4) << 8 | *(ushort *)(data + 4) >> 8;
  uVar3 = (uint)uVar2;
  if (uVar2 != 0) {
    lVar4 = 0;
    do {
      bVar1 = true;
      if (((((uint)data[lVar4 + 0xc] == (int)*(char *)CONCAT44(in_register_00000034,fontstart)) &&
           ((uint)data[lVar4 + 0xd] == (int)*(char *)(CONCAT44(in_register_00000034,fontstart) + 1))
           ) && ((uint)data[lVar4 + 0xe] ==
                 (int)*(char *)(CONCAT44(in_register_00000034,fontstart) + 2))) &&
         ((uint)data[lVar4 + 0xf] == (int)*(char *)(CONCAT44(in_register_00000034,fontstart) + 3)))
      {
        uVar3 = *(uint *)(data + lVar4 + 0x14);
        uVar3 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
        bVar1 = false;
      }
      if (!bVar1) {
        return uVar3;
      }
      lVar4 = lVar4 + 0x10;
    } while ((ulong)uVar2 * 0x10 != lVar4);
  }
  return 0;
}

Assistant:

NK_INTERN nk_uint
nk_tt__find_table(const nk_byte *data, nk_uint fontstart, const char *tag)
{
    /* @OPTIMIZE: binary search */
    nk_int num_tables = nk_ttUSHORT(data+fontstart+4);
    nk_uint tabledir = fontstart + 12;
    nk_int i;
    for (i = 0; i < num_tables; ++i) {
        nk_uint loc = tabledir + (nk_uint)(16*i);
        if (nk_tt_tag(data+loc+0, tag))
            return nk_ttULONG(data+loc+8);
    }
    return 0;
}